

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

Cpu * __thiscall Cpu::lookup_abi_cxx11_(Cpu *this)

{
  ostream *poVar1;
  long in_RSI;
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [36];
  uint local_56c;
  string local_568 [4];
  int bit_3;
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [36];
  uint local_464;
  string local_460 [4];
  int bit_2;
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [36];
  uint local_2bc;
  string local_2b8 [4];
  int bit_1;
  string local_298 [32];
  string local_278 [36];
  uint local_254;
  string local_250 [4];
  int bit;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  undefined4 local_1d0;
  allocator local_1cb;
  ushort local_1ca;
  ostringstream local_1c8 [6];
  unsigned_short mne;
  ostringstream outs;
  allocator local_39;
  string local_38 [8];
  string op;
  Cpu *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  local_1ca = *(ushort *)(in_RSI + 0x106 + (ulong)*(ushort *)(in_RSI + 0x22118) * 2);
  if (local_1ca == 0xfff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"END",&local_1cb);
    std::allocator<char>::~allocator((allocator<char> *)&local_1cb);
  }
  else if ((int)(uint)local_1ca >> 8 == 10) {
    poVar1 = std::operator<<((ostream *)local_1c8,"jmp ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(poVar1,local_1ca & 0x1ff);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_38,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::string((string *)this,local_38);
  }
  else if ((int)(uint)local_1ca >> 8 == 0xb) {
    poVar1 = std::operator<<((ostream *)local_1c8,"jmp ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(poVar1,local_1ca & 0x1ff);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_38,local_210);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::string((string *)this,local_38);
  }
  else {
    if ((int)(uint)local_1ca >> 8 == 0xc) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, #");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,(uint)(byte)local_1ca);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_230);
      std::__cxx11::string::~string(local_230);
    }
    else if ((int)(uint)local_1ca >> 5 == 1) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1,", w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_250);
      std::__cxx11::string::~string(local_250);
    }
    else if ((int)(uint)local_1ca >> 8 == 5) {
      local_254 = local_1ca >> 5 & 7;
      poVar1 = std::operator<<((ostream *)local_1c8,"setb ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      poVar1 = std::operator<<(poVar1,".");
      std::ostream::operator<<(poVar1,local_254);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_278);
      std::__cxx11::string::~string(local_278);
    }
    else if ((int)(uint)local_1ca >> 5 == 0xf) {
      poVar1 = std::operator<<((ostream *)local_1c8,"add ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1,", w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_298);
      std::__cxx11::string::~string(local_298);
    }
    else if ((int)(uint)local_1ca >> 5 == 0xe) {
      poVar1 = std::operator<<((ostream *)local_1c8,"add w, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_2b8);
      std::__cxx11::string::~string(local_2b8);
    }
    else if ((int)(uint)local_1ca >> 8 == 6) {
      local_2bc = local_1ca >> 5 & 7;
      poVar1 = std::operator<<((ostream *)local_1c8,"snb ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      poVar1 = std::operator<<(poVar1,".");
      std::ostream::operator<<(poVar1,local_2bc);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_2e0);
      std::__cxx11::string::~string(local_2e0);
    }
    else if ((int)(uint)local_1ca >> 5 == 0xb) {
      poVar1 = std::operator<<((ostream *)local_1c8,"and ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1,", w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_300);
      std::__cxx11::string::~string(local_300);
    }
    else if ((int)(uint)local_1ca >> 5 == 10) {
      poVar1 = std::operator<<((ostream *)local_1c8,"and w, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_320);
      std::__cxx11::string::~string(local_320);
    }
    else if ((int)(uint)local_1ca >> 8 == 0xe) {
      poVar1 = std::operator<<((ostream *)local_1c8,"and w, #");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,(uint)(byte)local_1ca);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_340);
      std::__cxx11::string::~string(local_340);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x13) {
      poVar1 = std::operator<<((ostream *)local_1c8,"not ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_360);
      std::__cxx11::string::~string(local_360);
    }
    else if ((int)(uint)local_1ca >> 5 == 9) {
      poVar1 = std::operator<<((ostream *)local_1c8,"or ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1,", w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_380);
      std::__cxx11::string::~string(local_380);
    }
    else if ((int)(uint)local_1ca >> 8 == 0xd) {
      poVar1 = std::operator<<((ostream *)local_1c8,"or w, #");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,(uint)(byte)local_1ca);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_3a0);
      std::__cxx11::string::~string(local_3a0);
    }
    else if ((int)(uint)local_1ca >> 5 == 8) {
      poVar1 = std::operator<<((ostream *)local_1c8,"or w, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_3c0);
      std::__cxx11::string::~string(local_3c0);
    }
    else if ((int)(uint)local_1ca >> 5 == 0xd) {
      poVar1 = std::operator<<((ostream *)local_1c8,"xor ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1,", w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_3e0);
      std::__cxx11::string::~string(local_3e0);
    }
    else if ((int)(uint)local_1ca >> 5 == 0xc) {
      poVar1 = std::operator<<((ostream *)local_1c8,"xor w, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_400);
      std::__cxx11::string::~string(local_400);
    }
    else if ((int)(uint)local_1ca >> 8 == 0xf) {
      poVar1 = std::operator<<((ostream *)local_1c8,"xor w, #");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,(uint)(byte)local_1ca);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_420);
      std::__cxx11::string::~string(local_420);
    }
    else if ((int)(uint)local_1ca >> 5 == 3) {
      poVar1 = std::operator<<((ostream *)local_1c8,"clr ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_440);
      std::__cxx11::string::~string(local_440);
    }
    else if (local_1ca == 0x40) {
      std::__cxx11::string::operator=(local_38,"clr w");
    }
    else if (local_1ca == 4) {
      std::__cxx11::string::operator=(local_38,"clr !WDT");
    }
    else if ((int)(uint)local_1ca >> 5 == 7) {
      poVar1 = std::operator<<((ostream *)local_1c8,"dec ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_460);
      std::__cxx11::string::~string(local_460);
    }
    else if ((int)(uint)local_1ca >> 8 == 7) {
      local_464 = local_1ca >> 5 & 7;
      poVar1 = std::operator<<((ostream *)local_1c8,"sb ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      poVar1 = std::operator<<(poVar1,".");
      std::ostream::operator<<(poVar1,local_464);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_488);
      std::__cxx11::string::~string(local_488);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x17) {
      poVar1 = std::operator<<((ostream *)local_1c8,"decsz ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_4a8);
      std::__cxx11::string::~string(local_4a8);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x15) {
      poVar1 = std::operator<<((ostream *)local_1c8,"inc ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_4c8);
      std::__cxx11::string::~string(local_4c8);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x1f) {
      poVar1 = std::operator<<((ostream *)local_1c8,"incsz ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_4e8);
      std::__cxx11::string::~string(local_4e8);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x1b) {
      poVar1 = std::operator<<((ostream *)local_1c8,"RL ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_508);
      std::__cxx11::string::~string(local_508);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x19) {
      poVar1 = std::operator<<((ostream *)local_1c8,"RR ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_528);
      std::__cxx11::string::~string(local_528);
    }
    else if ((int)(uint)local_1ca >> 5 == 5) {
      poVar1 = std::operator<<((ostream *)local_1c8,"sub ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1," w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_548);
      std::__cxx11::string::~string(local_548);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x1d) {
      poVar1 = std::operator<<((ostream *)local_1c8,"swap ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_568);
      std::__cxx11::string::~string(local_568);
    }
    else if ((int)(uint)local_1ca >> 8 == 4) {
      local_56c = local_1ca >> 5 & 7;
      poVar1 = std::operator<<((ostream *)local_1c8,"clrb ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      poVar1 = std::operator<<(poVar1,".");
      std::ostream::operator<<(poVar1,local_56c);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_590);
      std::__cxx11::string::~string(local_590);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x10) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_5b0);
      std::__cxx11::string::~string(local_5b0);
    }
    else if ((int)(uint)local_1ca >> 5 == 4) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::operator<<(poVar1,"-w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_5d0);
      std::__cxx11::string::~string(local_5d0);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x12) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, /");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_5f0);
      std::__cxx11::string::~string(local_5f0);
    }
    else if ((int)(uint)local_1ca >> 5 == 6) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, --");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_610);
      std::__cxx11::string::~string(local_610);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x14) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, ++");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_630);
      std::__cxx11::string::~string(local_630);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x1a) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, <<");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_650);
      std::__cxx11::string::~string(local_650);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x18) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, <<");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_670);
      std::__cxx11::string::~string(local_670);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x1c) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov w, <>");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_690);
      std::__cxx11::string::~string(local_690);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x16) {
      poVar1 = std::operator<<((ostream *)local_1c8,"movsz w, --");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_6b0);
      std::__cxx11::string::~string(local_6b0);
    }
    else if ((int)(uint)local_1ca >> 5 == 0x1e) {
      poVar1 = std::operator<<((ostream *)local_1c8,"movsz w, ++");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0x1f);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_6d0);
      std::__cxx11::string::~string(local_6d0);
    }
    else if (local_1ca == 0x43) {
      std::operator<<((ostream *)local_1c8,"mov m, w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_6f0);
      std::__cxx11::string::~string(local_6f0);
    }
    else if ((int)(uint)local_1ca >> 4 == 5) {
      poVar1 = std::operator<<((ostream *)local_1c8,"mov m, #");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1ca & 0xf);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_710);
      std::__cxx11::string::~string(local_710);
    }
    else if (local_1ca == 2) {
      std::operator<<((ostream *)local_1c8,"mov !option, w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_730);
      std::__cxx11::string::~string(local_730);
    }
    else if ((local_1ca < 5) || (9 < local_1ca)) {
      if ((int)(uint)local_1ca >> 5 == 0x11) {
        poVar1 = std::operator<<((ostream *)local_1c8,"test ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1ca & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_770);
        std::__cxx11::string::~string(local_770);
      }
      else if (local_1ca == 0) {
        std::operator<<((ostream *)local_1c8,"nop");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_790);
        std::__cxx11::string::~string(local_790);
      }
      else if ((int)(uint)local_1ca >> 8 == 9) {
        poVar1 = std::operator<<((ostream *)local_1c8,"call ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<
                  (poVar1,(**(byte **)(in_RSI + 0x22120) & 0xffffffe0) << 4 | (uint)(byte)local_1ca)
        ;
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_7b0);
        std::__cxx11::string::~string(local_7b0);
      }
      else if (local_1ca == 0xc) {
        std::operator<<((ostream *)local_1c8,"ret");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_7d0);
        std::__cxx11::string::~string(local_7d0);
      }
      else if (local_1ca == 0xd) {
        std::operator<<((ostream *)local_1c8,"retp");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_7f0);
        std::__cxx11::string::~string(local_7f0);
      }
      else if ((int)(uint)local_1ca >> 8 == 8) {
        poVar1 = std::operator<<((ostream *)local_1c8,"retw ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,(uint)(byte)local_1ca);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_810);
        std::__cxx11::string::~string(local_810);
      }
      else if ((int)(uint)local_1ca >> 3 == 3) {
        poVar1 = std::operator<<((ostream *)local_1c8,"bank ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1ca & 7);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_830);
        std::__cxx11::string::~string(local_830);
      }
      else if ((int)(uint)local_1ca >> 3 == 2) {
        poVar1 = std::operator<<((ostream *)local_1c8,"page ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1ca & 7);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_850);
        std::__cxx11::string::~string(local_850);
      }
      else if (local_1ca == 0x41) {
        std::operator<<((ostream *)local_1c8,"IREAD");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_870);
        std::__cxx11::string::~string(local_870);
      }
      else {
        poVar1 = std::operator<<((ostream *)local_1c8,"not impl ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1ca);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_38,local_890);
        std::__cxx11::string::~string(local_890);
      }
    }
    else {
      std::operator<<((ostream *)local_1c8,"mov !rx, w");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_38,local_750);
      std::__cxx11::string::~string(local_750);
    }
    std::__cxx11::string::string((string *)this,local_38);
  }
  local_1d0 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

string Cpu::lookup()
{
	string
	op = "";
	ostringstream outs;
	USHORT
	mne = ROM[pc];
	if (mne == 0xfff)
	{
		return "END";
	}
	if (mne >> 8 == 0xa)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xb)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xc)
	{				//mov w,lit
		outs << "mov w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 1)
	{				//mov fr,w
		outs << "mov " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 8 == 5)
	{				//setb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "setb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0xf)
	{				//add fr,w
		outs << "add " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 0xe)
	{				//add w,fr
		outs << "add w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 6)
	{				//snb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "snb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 11)
	{				//and fr,w
		outs << "and " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 10)
	{				//and w,fr
		outs << "and w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 0xe)
	{				//and w,#lit
		outs << "and w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 0x13)
	{				//not fr
		outs << "not " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 9)
	{				//or fr,w
		outs << "or " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 8 == 0xd)
	{				//or w,#lit
		outs << "or w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 8)
	{				//or w,fr
		outs << "or w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 13)
	{				//xor fr,w
		outs << "xor " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 12)
	{				//xor w,fr
		outs << "xor w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 0xf)
	{				//xor w,#lit
		outs << "xor w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 3)
	{				//clr fr
		outs << "clr " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0x40)
	{				//clr w
		op = "clr w";
	}
	else if (mne == 4)
	{				//clr !WDT
		op = "clr !WDT";
	}
	else if (mne >> 5 == 7)
	{				//dec fr
		outs << "dec " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 7)
	{				//sb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "sb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 0x17)
	{				//decsz fr
		outs << "decsz " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x15)
	{				//inc fr
		outs << "inc " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1f)
	{				//incsz fr
		outs << "incsz " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1b)
	{				//RL fr
		outs << "RL " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x19)
	{				//RR fr
		outs << "RR " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 5)
	{				//sub fr,w
		outs << "sub " << hex << (mne & 0x1f) << " w";
		op = outs.str();
	}
	else if (mne >> 5 == 0x1d)
	{				//swap fr
		outs << "swap " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 4)
	{				//clrb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "clrb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 0x10)
	{				//mov w,fr
		outs << "mov w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x4)
	{				//mov w,fr-w
		outs << "mov w, " << hex << (mne & 0x1f) << "-w";
		op = outs.str();
	}
	else if (mne >> 5 == 0x12)
	{				//mov w,/fr (complement)
		outs << "mov w, /" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x6)
	{				//mov w,--fr
		outs << "mov w, --" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x14)
	{				//mov w,++fr
		outs << "mov w, ++" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1a)
	{				//mov w,<<fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x18)
	{				//mov w,>>fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1c)
	{				//mov w,<>fr
		outs << "mov w, <>" << hex << (mne & 0x1f);
		op = outs.str();
	}
	//TODO: mov w,m
	else if (mne >> 5 == 0x16)
	{				//movsz w,--fr
		outs << "movsz w, --" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1e)
	{				//movsz w,++fr
		outs << "movsz w, ++" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0x43)
	{ //mov m,w
		outs << "mov m, w";
		op = outs.str();
	}
	else if (mne >> 4 == 0x5)
	{ //mov m,#lit
		outs << "mov m, #" << hex << (mne&0xf);
		op = outs.str();
	}
	else if (mne == 0x2)
	{ //mov !option,w
		outs << "mov !option, w";
		op = outs.str();
	}
	else if (mne > 4 && mne < 10)
	{
		outs << "mov !rx, w";
		op = outs.str();
	}
	//mov !option,w
	else if (mne >> 5 == 0x11)
	{				//test fr
		outs << "test " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0)
	{				//nop
		outs << "nop";
		op = outs.str();
	}
	else if (mne >> 8 == 9)
	{ //call addr8
		outs << "call " << hex << ((*status & 0xe0) << 4 | mne & 0xff);
		op = outs.str();
	}
	else if (mne == 0xc)
	{ //ret
		outs << "ret";
		op = outs.str();
	}
	else if (mne == 0xd)
	{ //retp
		outs << "retp";
		op = outs.str();
	}
	else if (mne >> 8 == 0x8)
	{ //retw #lit
		outs << "retw " << hex << (mne&0xff);
		op = outs.str();
	}
	else if (mne >> 3 == 3)
	{ //bank addr12
		outs << "bank " << hex << (mne&7);
		op = outs.str();
	}
	else if (mne >> 3 == 2)
	{ //page addr12
		outs << "page " << hex << (mne&7);
		op = outs.str();
	}
	else if (mne == 0x41)
	{ //IREAD
		outs << "IREAD";
		op = outs.str();
	}
	else
	{
		outs << "not impl " << hex << mne;
		op = outs.str();
	}
	return op;
}